

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O3

json_iterator __thiscall JSONNode::end(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  internalJSONNode *piVar3;
  long *in_RSI;
  bool condition;
  json_string local_50;
  
  lVar2 = *in_RSI;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"no internal","");
  JSONDebug::_JSON_ASSERT(lVar2 != 0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_50.field_2._7_4_ = 0x6c616e72;
  local_50._M_string_length = 0xb;
  local_50.field_2._M_local_buf[0xb] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(*in_RSI != 0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  condition = true;
  if (*(char *)*in_RSI != '\x05') {
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    condition = *(char *)*in_RSI == '\x04';
  }
  if (jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single == '\0') {
    end();
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single,
             DAT_00126388 + jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single);
  std::__cxx11::string::append((char *)&local_50);
  JSONDebug::_JSON_ASSERT(condition,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_50.field_2._7_4_ = 0x6c616e72;
  local_50._M_string_length = 0xb;
  local_50.field_2._M_local_buf[0xb] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(*in_RSI != 0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  piVar3 = internalJSONNode::makeUnique((internalJSONNode *)*in_RSI);
  *in_RSI = (long)piVar3;
  piVar3 = (internalJSONNode *)internalJSONNode::end(piVar3);
  this->internal = piVar3;
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::end(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("end"));
	   makeUniqueInternal();
	   return json_iterator(internal -> end());
    }